

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

String * __thiscall
capnp::compiler::CompilerMain::getDisplayName
          (String *__return_storage_ptr__,CompilerMain *this,ReadableDirectory *dir,PathPtr path)

{
  String *pSVar1;
  String *pSVar2;
  int iVar3;
  kj *this_00;
  Filesystem *pFVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CompilerMain *params_1;
  Fault local_80;
  Fault f;
  String local_68;
  kj *local_50;
  String *prefix;
  Maybe<kj::String_&> local_40;
  kj *local_38;
  String *_prefix2016;
  ReadableDirectory *dir_local;
  CompilerMain *this_local;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)path.parts.size_;
  params_1 = (CompilerMain *)path.parts.ptr;
  prefix = (String *)dir;
  _prefix2016 = (String *)dir;
  dir_local = (ReadableDirectory *)this;
  this_local = params_1;
  path_local.parts.size_ = (size_t)__return_storage_ptr__;
  kj::HashMap<kj::ReadableDirectory_const*,kj::String>::find<kj::ReadableDirectory_const*>
            ((HashMap<kj::ReadableDirectory_const*,kj::String> *)&local_40,
             (ReadableDirectory **)&this->dirPrefixes);
  this_00 = (kj *)kj::_::readMaybe<kj::String>(&local_40);
  pSVar1 = _prefix2016;
  local_38 = this_00;
  if (this_00 == (kj *)0x0) {
    pFVar4 = kj::Own<kj::Filesystem,_std::nullptr_t>::operator->(&this->disk);
    iVar3 = (**pFVar4->_vptr_Filesystem)();
    pSVar2 = _prefix2016;
    if (pSVar1 == (String *)CONCAT44(extraout_var,iVar3)) {
      kj::PathPtr::toNativeString(__return_storage_ptr__,(PathPtr *)&this_local,true);
    }
    else {
      pFVar4 = kj::Own<kj::Filesystem,_std::nullptr_t>::operator->(&this->disk);
      iVar3 = (*pFVar4->_vptr_Filesystem[1])();
      if (pSVar2 != (String *)CONCAT44(extraout_var_00,iVar3)) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
                  (&local_80,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnp.c++"
                   ,0x7e7,FAILED,(char *)0x0,"\"unrecognized directory\"",
                   (char (*) [23])"unrecognized directory");
        kj::_::Debug::Fault::fatal(&local_80);
      }
      kj::PathPtr::toNativeString(__return_storage_ptr__,(PathPtr *)&this_local,false);
    }
  }
  else {
    local_50 = this_00;
    kj::PathPtr::toNativeString(&local_68,(PathPtr *)&this_local,false);
    kj::str<kj::String&,kj::String>(__return_storage_ptr__,this_00,&local_68,(String *)params_1);
    kj::String::~String(&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::String getDisplayName(const kj::ReadableDirectory& dir, kj::PathPtr path) {
    KJ_IF_SOME(prefix, dirPrefixes.find(&dir)) {
      return kj::str(prefix, path.toNativeString());
    } else if (&dir == &disk->getRoot()) {
      return path.toNativeString(true);
    } else if (&dir == &disk->getCurrent()) {
      return path.toNativeString(false);
    } else {
      KJ_FAIL_ASSERT("unrecognized directory");
    }
  }
};

}